

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O1

void test_distribute<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,MxxDistribution_DistributePairVector_Test::TestBody()::__0>
               (size_type size,comm *param_2)

{
  pointer ppVar1;
  bool bVar2;
  unsigned_long uVar3;
  size_type sVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  T expected;
  AssertionResult gtest_ar;
  size_t eq_size;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> eq_distr;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> vec;
  AssertHelper local_c8;
  pair<int,_int> local_c0;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertHelper local_a8;
  ulong local_a0;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_98;
  size_type local_80;
  custom_op<unsigned_long> local_78;
  
  local_80 = size;
  uVar3 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_80,param_2,1);
  mxx::custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_78,1);
  MPI_Allreduce(&local_80,&local_98,1,local_78.m_type_copy,local_78.m_op,param_2->mpi_comm);
  ppVar1 = local_98.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  mxx::custom_op<unsigned_long>::~custom_op(&local_78);
  local_78._vptr_custom_op = (_func_int **)0x0;
  local_78.m_user_func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_78.m_user_func.super__Function_base._M_functor._8_8_ = 0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_78,
             local_80);
  srand(param_2->m_rank * 0xd);
  if (local_80 != 0) {
    sVar4 = 0;
    do {
      iVar6 = (int)uVar3 + (int)sVar4;
      *(int *)(local_78._vptr_custom_op + sVar4) = iVar6;
      *(int *)((long)(local_78._vptr_custom_op + sVar4) + 4) = iVar6;
      sVar4 = sVar4 + 1;
    } while (local_80 != sVar4);
  }
  mxx::impl::
  distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  distribute(&local_98,
             (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_78,param_2
            );
  mxx::impl::
  distribute_container<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  distribute_inplace((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_78
                     ,param_2);
  local_a0 = (ulong)ppVar1 / (ulong)(long)param_2->m_size;
  if ((ulong)(long)param_2->m_rank < (ulong)ppVar1 % (ulong)(long)param_2->m_size) {
    local_a0 = local_a0 + 1;
  }
  uVar3 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_a0,param_2,1);
  local_c0 = (pair<int,_int>)
             ((long)local_98.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_b8,"eq_size","eq_distr.size()",&local_a0,(unsigned_long *)&local_c0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
               ,0x36,pcVar7);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0 != (pair<int,_int>)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_c0 != (pair<int,_int>)0x0)) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
      local_c0.first = 0;
      local_c0.second = 0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_c0 = (pair<int,_int>)
               ((long)local_78.m_user_func.super__Function_base._M_functor._M_unused._0_8_ -
                (long)local_78._vptr_custom_op >> 3);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_b8,"eq_size","vec.size()",&local_a0,(unsigned_long *)&local_c0);
    if (local_b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c0);
      if (local_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_b0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
                 ,0x37,pcVar7);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_c0 != (pair<int,_int>)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_c0 != (pair<int,_int>)0x0)) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
        local_c0.first = 0;
        local_c0.second = 0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      mxx::impl::
      samplesort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
                (local_78._vptr_custom_op,
                 local_78.m_user_func.super__Function_base._M_functor._M_unused._M_object,param_2);
      mxx::impl::
      samplesort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
                (local_98.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_98.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,param_2);
      if (local_98.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_98.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar9 = uVar3 << 0x20;
        lVar5 = 0;
        uVar8 = 0;
        do {
          local_c0 = (pair<int,_int>)((uVar3 & 0xffffffff) + lVar9);
          testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
                    (local_b8,"expected","eq_distr[i]",&local_c0,
                     (pair<int,_int> *)
                     ((long)&(local_98.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first + lVar5));
          if (local_b8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_c8);
            if (local_b0.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = ((local_b0.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
                       ,0x3e,pcVar7);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_c8.data_ + 8))();
              }
              local_c8.data_ = (AssertHelperData *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperEQ<std::pair<int,int>,std::pair<int,int>>
                    (local_b8,"expected","vec[i]",&local_c0,
                     (pair<int,_int> *)((long)local_78._vptr_custom_op + lVar5));
          if (local_b8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_c8);
            if (local_b0.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = ((local_b0.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_distribution.cpp"
                       ,0x3f,pcVar7);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c8);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (local_c8.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_c8.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_c8.data_ + 8))();
              }
              local_c8.data_ = (AssertHelperData *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            break;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 0x100000000;
          uVar3 = (unsigned_long)((int)uVar3 + 1);
          lVar5 = lVar5 + 8;
        } while (uVar8 < (ulong)((long)local_98.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_98.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
  }
  if (local_98.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78._vptr_custom_op != (_func_int **)0x0) {
    operator_delete(local_78._vptr_custom_op,
                    local_78.m_user_func.super__Function_base._M_functor._8_8_ -
                    (long)local_78._vptr_custom_op);
  }
  return;
}

Assistant:

void test_distribute(size_t size, Func gen, const mxx::comm& c) {
    size_t prefix = mxx::exscan(size, c);
    size_t total_size = mxx::allreduce(size, c);

    typedef typename Container::value_type T;
    Container vec;
    vec.resize(size);
    std::srand(13*c.rank());
    for (size_t i = 0; i < size; ++i) {
        vec[i] = gen(prefix+i);
    }

    // stable distribute
    Container eq_distr = mxx::distribute(vec, c);
    mxx::distribute_inplace(vec, c);

    // get expected size
    size_t eq_size = total_size / c.size();
    if ((size_t)c.rank() < total_size % c.size())
        eq_size+=1;
    size_t eq_prefix = mxx::exscan(eq_size, c);

    ASSERT_EQ(eq_size, eq_distr.size());
    ASSERT_EQ(eq_size, vec.size());

    mxx::sort(vec.begin(), vec.end(), c);
    mxx::sort(eq_distr.begin(), eq_distr.end(), c);

    for (size_t i = 0; i < eq_distr.size(); ++i) {
        T expected = gen(eq_prefix+i);
        ASSERT_EQ(expected, eq_distr[i]);
        ASSERT_EQ(expected, vec[i]);
    }
}